

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O3

wchar_t archive_read_format_tar_bid(archive_read *a,wchar_t best_bid)

{
  char *pcVar1;
  byte bVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  archive_read *a_00;
  long lVar5;
  int iVar6;
  int iVar7;
  void *h;
  
  h = (void *)0x200;
  a_00 = (archive_read *)__archive_read_ahead(a,0x200,(ssize_t *)0x0);
  if (a_00 == (archive_read *)0x0) {
    wVar4 = L'\xffffffff';
  }
  else {
    if ((char)(a_00->archive).magic == '\0') {
      lVar5 = 1;
      do {
        if ((int)lVar5 == 0x200) {
          return L'\n';
        }
        pcVar1 = (char *)((long)&(a_00->archive).magic + lVar5);
        lVar5 = lVar5 + 1;
      } while (*pcVar1 == '\0');
    }
    wVar3 = checksum(a_00,h);
    wVar4 = L'\0';
    if (wVar3 != L'\0') {
      iVar6 = 0x30;
      if ((*(short *)((long)&(a_00->client).dataset + 5) == 0x72 &&
           *(int *)((long)&(a_00->client).dataset + 1) == 0x61747375) &&
         (iVar6 = 0x30, *(short *)((long)&(a_00->client).dataset + 7) == 0x3030)) {
        iVar6 = 0x68;
      }
      iVar7 = iVar6;
      if ((*(short *)((long)&(a_00->client).dataset + 5) == 0x2072 &&
           *(int *)((long)&(a_00->client).dataset + 1) == 0x61747375) &&
         (iVar7 = iVar6 + 0x38, *(short *)((long)&(a_00->client).dataset + 7) != 0x20)) {
        iVar7 = iVar6;
      }
      bVar2 = *(byte *)((long)&a_00->read_data_offset + 4);
      if (((((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) || (bVar2 == 0)) || ((byte)(bVar2 - 0x30) < 10))
         && (((bVar2 = (byte)(a_00->archive).current_oemcp, bVar2 - 0x30 < 8 || (bVar2 == 0)) ||
             ((bVar2 == 0xff || (wVar4 = L'\0', bVar2 == 0x20)))))) {
        wVar4 = iVar7 + L'\x02';
      }
    }
  }
  return wVar4;
}

Assistant:

static int
archive_read_format_tar_bid(struct archive_read *a, int best_bid)
{
	int bid;
	const char *h;
	const struct archive_entry_header_ustar *header;

	(void)best_bid; /* UNUSED */

	bid = 0;

	/* Now let's look at the actual header and see if it matches. */
	h = __archive_read_ahead(a, 512, NULL);
	if (h == NULL)
		return (-1);

	/* If it's an end-of-archive mark, we can handle it. */
	if (h[0] == 0 && archive_block_is_null(h)) {
		/*
		 * Usually, I bid the number of bits verified, but
		 * in this case, 4096 seems excessive so I picked 10 as
		 * an arbitrary but reasonable-seeming value.
		 */
		return (10);
	}

	/* If it's not an end-of-archive mark, it must have a valid checksum.*/
	if (!checksum(a, h))
		return (0);
	bid += 48;  /* Checksum is usually 6 octal digits. */

	header = (const struct archive_entry_header_ustar *)h;

	/* Recognize POSIX formats. */
	if ((memcmp(header->magic, "ustar\0", 6) == 0)
	    && (memcmp(header->version, "00", 2) == 0))
		bid += 56;

	/* Recognize GNU tar format. */
	if ((memcmp(header->magic, "ustar ", 6) == 0)
	    && (memcmp(header->version, " \0", 2) == 0))
		bid += 56;

	/* Type flag must be null, digit or A-Z, a-z. */
	if (header->typeflag[0] != 0 &&
	    !( header->typeflag[0] >= '0' && header->typeflag[0] <= '9') &&
	    !( header->typeflag[0] >= 'A' && header->typeflag[0] <= 'Z') &&
	    !( header->typeflag[0] >= 'a' && header->typeflag[0] <= 'z') )
		return (0);
	bid += 2;  /* 6 bits of variation in an 8-bit field leaves 2 bits. */

	/* Sanity check: Look at first byte of mode field. */
	switch (255 & (unsigned)header->mode[0]) {
	case 0: case 255:
		/* Base-256 value: No further verification possible! */
		break;
	case ' ': /* Not recommended, but not illegal, either. */
		break;
	case '0': case '1': case '2': case '3':
	case '4': case '5': case '6': case '7':
		/* Octal Value. */
		/* TODO: Check format of remainder of this field. */
		break;
	default:
		/* Not a valid mode; bail out here. */
		return (0);
	}
	/* TODO: Sanity test uid/gid/size/mtime/rdevmajor/rdevminor fields. */

	return (bid);
}